

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateI32Arr
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  bool bVar1;
  spv_result_t sVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  ostream *poVar5;
  Instruction *inst_00;
  char *__rhs;
  uint32_t underlying_type;
  ostringstream ss;
  undefined1 local_1cc [36];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  inst_00 = (Instruction *)local_1cc;
  local_1cc._0_4_ = 0;
  sVar2 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)inst_00);
  if (sVar2 == SPV_SUCCESS) {
    pIVar4 = ValidationState_t::FindDef(this->_,local_1cc._0_4_);
    if ((pIVar4->inst_).opcode == 0x1c) {
      uVar3 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[2];
      bVar1 = ValidationState_t::IsIntScalarType(this->_,uVar3);
      if (bVar1) {
        uVar3 = ValidationState_t::GetBitWidth(this->_,uVar3);
        if (uVar3 == 0x20) {
          return SPV_SUCCESS;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
        poVar5 = std::operator<<((ostream *)local_1a8,(string *)(local_1cc + 4));
        poVar5 = std::operator<<(poVar5," has components with bit width ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,".");
        std::__cxx11::string::_M_dispose();
        std::__cxx11::stringbuf::str();
        sVar2 = std::
                function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()(diag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_1cc + 4));
        std::__cxx11::string::_M_dispose();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        return sVar2;
      }
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
      __rhs = " components are not int scalar.";
    }
    else {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)(local_1cc + 4),decoration,(Decoration *)inst,inst_00);
      __rhs = " is not an array.";
    }
    std::operator+(local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1cc + 4),__rhs);
    sVar2 = std::
            function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(diag,local_1a8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateI32Arr(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsIntScalarType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " components are not int scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}